

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O2

void __thiscall
sznet::WeakCallback<sznet::net::KcpConnection>::WeakCallback
          (WeakCallback<sznet::net::KcpConnection> *this,weak_ptr<sznet::net::KcpConnection> *object
          ,function<void_(sznet::net::KcpConnection_*)> *function)

{
  std::__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this,
             &object->super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void_(sznet::net::KcpConnection_*)>::function(&this->m_function,function);
  return;
}

Assistant:

WeakCallback(const std::weak_ptr<CLASS>& object, const std::function<void(CLASS*, ARGS...)>& function): 
		m_object(object),
		m_function(function)
	{
	}